

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

string * __thiscall
google::protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view action,MessageLite *message)

{
  string_view sVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string local_b0;
  undefined8 local_90;
  char *local_88;
  void *local_80;
  size_t local_78;
  undefined8 local_70;
  char *local_68;
  string_view local_60;
  undefined8 local_50;
  char *local_48;
  size_type local_40;
  pointer local_38;
  
  sVar1 = MessageLite::GetTypeName((MessageLite *)action._M_str);
  MessageLite::InitializationErrorString_abi_cxx11_(&local_b0,(MessageLite *)action._M_str);
  local_90 = 6;
  local_88 = "Can\'t ";
  local_70 = 0x12;
  local_68 = " message of type \"";
  local_50 = 0x29;
  local_48 = "\" because it is missing required fields: ";
  local_40 = local_b0._M_string_length;
  local_38 = local_b0._M_dataplus._M_p;
  pieces._M_len = local_b0._M_string_length;
  pieces._M_array = (iterator)0x6;
  local_80 = this;
  local_78 = action._M_len;
  local_60 = sVar1;
  absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_90,pieces);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializationErrorMessage(absl::string_view action,
                                       const MessageLite& message) {
  return absl::StrCat("Can't ", action, " message of type \"",
                      message.GetTypeName(),
                      "\" because it is missing required fields: ",
                      message.InitializationErrorString());
}